

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void output_GLSL_uniform_array(Context *ctx,RegisterType regtype,int size)

{
  size_t in_RCX;
  char *pcVar1;
  char buf [64];
  char acStack_58 [64];
  
  if (0 < size) {
    get_GLSL_uniform_array_varname(ctx,regtype,acStack_58,in_RCX);
    if (regtype == REG_TYPE_CONST) {
      pcVar1 = "vec4";
    }
    else if (regtype == REG_TYPE_CONSTBOOL) {
      pcVar1 = "bool";
    }
    else {
      if (regtype != REG_TYPE_CONSTINT) {
        fail(ctx,"BUG: used a uniform we don\'t know how to define.");
        return;
      }
      pcVar1 = "ivec4";
    }
    output_line(ctx,"uniform %s %s[%d];",pcVar1,acStack_58,(ulong)(uint)size);
  }
  return;
}

Assistant:

static void output_GLSL_uniform_array(Context *ctx, const RegisterType regtype,
                                      const int size)
{
    if (size > 0)
    {
        char buf[64];
        get_GLSL_uniform_array_varname(ctx, regtype, buf, sizeof (buf));
        const char *typ;
        switch (regtype)
        {
            case REG_TYPE_CONST: typ = "vec4"; break;
            case REG_TYPE_CONSTINT: typ ="ivec4"; break;
            case REG_TYPE_CONSTBOOL: typ = "bool"; break;
            default:
            {
                fail(ctx, "BUG: used a uniform we don't know how to define.");
                return;
            } // default
        } // switch
        output_line(ctx, "uniform %s %s[%d];", typ, buf, size);
    } // if
}